

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

IrRef ir_emit(Trace *trace,IrIns ins)

{
  int iVar1;
  IrIns *pIVar2;
  int iVar3;
  
  iVar3 = trace->ir_count;
  iVar1 = trace->ir_capacity;
  if (iVar3 < iVar1) {
    pIVar2 = trace->ir;
  }
  else {
    trace->ir_capacity = iVar1 * 2;
    pIVar2 = (IrIns *)realloc(trace->ir,(long)iVar1 << 4);
    trace->ir = pIVar2;
    iVar3 = trace->ir_count;
  }
  trace->ir_count = iVar3 + 1;
  pIVar2[iVar3] = ins;
  return (IrRef)iVar3;
}

Assistant:

static IrRef ir_emit(Trace *trace, IrIns ins) {
	// Check if we need to reallocate the IR array
	if (trace->ir_count >= trace->ir_capacity) {
		trace->ir_capacity *= 2;
		trace->ir = realloc(trace->ir, sizeof(IrIns) * trace->ir_capacity);
	}

	// Add the IR instruction
	trace->ir[trace->ir_count++] = ins;
	return trace->ir_count - 1;
}